

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

size_t write_type(MIR_context_t ctx,writer_func_t writer,MIR_type_t t)

{
  size_t sVar1;
  
  sVar1 = put_byte(ctx,writer,t + 0x2b);
  return sVar1;
}

Assistant:

static size_t write_type (MIR_context_t ctx, writer_func_t writer, MIR_type_t t) {
  return put_byte (ctx, writer, TAG_TI8 + (t - MIR_T_I8));
}